

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(void *ptr_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiWindow *this;
  char **in_RCX;
  char **in_RDX;
  char *label_end;
  char *label;
  ImGuiWindow *window;
  char *in_stack_00000108;
  char *in_stack_00000110;
  ImGuiTreeNodeFlags in_stack_0000011c;
  ImGuiID in_stack_00000120;
  __va_list_tag *in_stack_ffffffffffffffc8;
  bool local_1;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    ImFormatStringToTempBufferV(in_RDX,in_RCX,(char *)this,in_stack_ffffffffffffffc8);
    ImGuiWindow::GetID(this,in_stack_ffffffffffffffc8);
    local_1 = TreeNodeBehavior(in_stack_00000120,in_stack_0000011c,in_stack_00000110,
                               in_stack_00000108);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeExV(const void* ptr_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const char* label, *label_end;
    ImFormatStringToTempBufferV(&label, &label_end, fmt, args);
    return TreeNodeBehavior(window->GetID(ptr_id), flags, label, label_end);
}